

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

void __thiscall vm::VM::DUP(VM *this)

{
  int iVar1;
  type piVar2;
  VM *this_local;
  
  ensureStackUsed(this,1);
  ensureStackRest(this,1);
  piVar2 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[]
                     (&this->_stack,(long)(this->_sp + -1));
  iVar1 = *piVar2;
  piVar2 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[]
                     (&this->_stack,(long)this->_sp);
  *piVar2 = iVar1;
  this->_sp = this->_sp + 1;
  return;
}

Assistant:

void VM::DUP() {
    ensureStackUsed(1);
    ensureStackRest(1);
    _stack[_sp] = _stack[_sp-1];
    ++_sp;
}